

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t varint_length_from_bytes(uchar *bytes)

{
  uchar uVar1;
  uchar *bytes_local;
  
  uVar1 = *bytes;
  if (uVar1 == 0xfd) {
    bytes_local = (uchar *)0x3;
  }
  else if (uVar1 == 0xfe) {
    bytes_local = (uchar *)0x5;
  }
  else if (uVar1 == 0xff) {
    bytes_local = (uchar *)0x9;
  }
  else {
    bytes_local = (uchar *)0x1;
  }
  return (size_t)bytes_local;
}

Assistant:

size_t varint_length_from_bytes(const unsigned char *bytes)
{
    switch (*bytes) {
    case VI_TAG_16:
        return sizeof(uint8_t) + sizeof(uint16_t);
    case VI_TAG_32:
        return sizeof(uint8_t) + sizeof(uint32_t);
    case VI_TAG_64:
        return sizeof(uint8_t) + sizeof(uint64_t);
    }
    return sizeof(uint8_t);
}